

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O1

void __thiscall
duckdb::WindowBoundariesState::PeerEnd
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,
          ValidityMask *partition_mask,ValidityMask *order_mask)

{
  data_ptr_t pdVar1;
  ulong *puVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  reference pvVar5;
  ulong uVar6;
  reference other;
  idx_t iVar7;
  idx_t n;
  idx_t local_38;
  
  if (this->order_count != 0) {
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&bounds->data,1);
    pdVar1 = pvVar5->data;
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&bounds->data,2);
    puVar2 = (ulong *)pvVar5->data;
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&bounds->data,3);
    if (count != 0) {
      pdVar3 = pvVar5->data;
      uVar6 = *puVar2;
      iVar7 = 0;
      do {
        uVar4 = puVar2[iVar7];
        if (uVar6 <= uVar4) {
          local_38 = 1;
          uVar6 = FindNextStart(order_mask,uVar4 + 1,*(idx_t *)(pdVar1 + iVar7 * 8),&local_38);
        }
        *(ulong *)(pdVar3 + iVar7 * 8) = uVar6;
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    return;
  }
  pvVar5 = vector<duckdb::Vector,_true>::operator[](&bounds->data,3);
  other = vector<duckdb::Vector,_true>::operator[](&bounds->data,1);
  Vector::Reference(pvVar5,other);
  return;
}

Assistant:

void WindowBoundariesState::PeerEnd(DataChunk &bounds, idx_t row_idx, const idx_t count,
                                    const ValidityMask &partition_mask, const ValidityMask &order_mask) {
	//	OVER()
	if (!order_count) {
		bounds.data[PEER_END].Reference(bounds.data[PARTITION_END]);
		return;
	}

	auto partition_end_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_END]);
	auto peer_begin_data = FlatVector::GetData<const idx_t>(bounds.data[PEER_BEGIN]);
	auto peer_end_data = FlatVector::GetData<idx_t>(bounds.data[PEER_END]);
	auto prev_end = peer_begin_data[0];
	for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
		const auto peer_start = peer_begin_data[chunk_idx];
		if (peer_start >= prev_end) {
			idx_t n = 1;
			const auto partition_end = partition_end_data[chunk_idx];
			prev_end = FindNextStart(order_mask, peer_start + 1, partition_end, n);
		}
		peer_end_data[chunk_idx] = prev_end;
	}
}